

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edk2_vss.cpp
# Opt level: O0

void __thiscall edk2_vss_t::_read(edk2_vss_t *this)

{
  int8_t iVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  validation_expr_error<unsigned_int> *this_00;
  kstream *pkVar5;
  vss_store_body_t *this_01;
  pointer p__io;
  unique_ptr<edk2_vss_t::vss_store_body_t,_std::default_delete<edk2_vss_t::vss_store_body_t>_>
  local_80;
  unique_ptr<kaitai::kstream,std::default_delete<kaitai::kstream>> local_78 [8];
  string local_70;
  undefined1 local_4a;
  allocator local_49;
  string local_48;
  uint32_t local_18;
  uint32_t local_14;
  edk2_vss_t *peStack_10;
  uint32_t _;
  edk2_vss_t *this_local;
  
  peStack_10 = this;
  uVar4 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_signature = uVar4;
  uVar4 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_vss_size = uVar4;
  uVar4 = vss_size(this);
  local_14 = uVar4;
  iVar1 = len_vss_store_header(this);
  if (((uint)(int)iVar1 < uVar4) && (local_14 != 0xffffffff)) {
    uVar2 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_format = uVar2;
    uVar2 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_state = uVar2;
    uVar3 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
    this->m_reserved = uVar3;
    uVar4 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
    this->m_reserved1 = uVar4;
    pkVar5 = (this->super_kstruct).m__io;
    uVar4 = vss_size(this);
    iVar1 = len_vss_store_header(this);
    kaitai::kstream::read_bytes_abi_cxx11_(&local_70,pkVar5,(ulong)(uVar4 - (int)iVar1));
    std::__cxx11::string::operator=((string *)&this->m__raw_body,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    pkVar5 = (kstream *)operator_new(0x198);
    kaitai::kstream::kstream(pkVar5,&this->m__raw_body);
    std::unique_ptr<kaitai::kstream,std::default_delete<kaitai::kstream>>::
    unique_ptr<std::default_delete<kaitai::kstream>,void>(local_78,pkVar5);
    std::unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::operator=
              (&this->m__io__raw_body,
               (unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_> *)local_78);
    std::unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::~unique_ptr
              ((unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_> *)local_78);
    this_01 = (vss_store_body_t *)operator_new(0x28);
    p__io = std::unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::get
                      (&this->m__io__raw_body);
    vss_store_body_t::vss_store_body_t(this_01,p__io,this,this->m__root);
    std::unique_ptr<edk2_vss_t::vss_store_body_t,std::default_delete<edk2_vss_t::vss_store_body_t>>
    ::unique_ptr<std::default_delete<edk2_vss_t::vss_store_body_t>,void>
              ((unique_ptr<edk2_vss_t::vss_store_body_t,std::default_delete<edk2_vss_t::vss_store_body_t>>
                *)&local_80,this_01);
    std::
    unique_ptr<edk2_vss_t::vss_store_body_t,_std::default_delete<edk2_vss_t::vss_store_body_t>_>::
    operator=(&this->m_body,&local_80);
    std::
    unique_ptr<edk2_vss_t::vss_store_body_t,_std::default_delete<edk2_vss_t::vss_store_body_t>_>::
    ~unique_ptr(&local_80);
    return;
  }
  local_4a = 1;
  this_00 = (validation_expr_error<unsigned_int> *)__cxa_allocate_exception(0x40);
  local_18 = vss_size(this);
  pkVar5 = kaitai::kstruct::_io(&this->super_kstruct);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"/seq/1",&local_49);
  kaitai::validation_expr_error<unsigned_int>::validation_expr_error
            (this_00,&local_18,pkVar5,&local_48);
  local_4a = 0;
  __cxa_throw(this_00,&kaitai::validation_expr_error<unsigned_int>::typeinfo,
              kaitai::validation_expr_error<unsigned_int>::~validation_expr_error);
}

Assistant:

void edk2_vss_t::_read() {
    m_signature = m__io->read_u4le();
    m_vss_size = m__io->read_u4le();
    {
        uint32_t _ = vss_size();
        if (!( ((_ > static_cast<uint32_t>(len_vss_store_header())) && (_ < 4294967295UL)) )) {
            throw kaitai::validation_expr_error<uint32_t>(vss_size(), _io(), std::string("/seq/1"));
        }
    }
    m_format = m__io->read_u1();
    m_state = m__io->read_u1();
    m_reserved = m__io->read_u2le();
    m_reserved1 = m__io->read_u4le();
    m__raw_body = m__io->read_bytes((vss_size() - len_vss_store_header()));
    m__io__raw_body = std::unique_ptr<kaitai::kstream>(new kaitai::kstream(m__raw_body));
    m_body = std::unique_ptr<vss_store_body_t>(new vss_store_body_t(m__io__raw_body.get(), this, m__root));
}